

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_crlf_eol.hpp
# Opt level: O0

eol_pair tao::pegtl::internal::lf_crlf_eol::
         match<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)1,tao::pegtl::ascii::eol::lf_crlf,char_const*>>
                   (memory_input<(tao::pegtl::tracking_mode)1,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                    *in)

{
  char cVar1;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar2;
  ulong extraout_RAX_01;
  eol_pair eVar3;
  size_t sStack_30;
  char a;
  bool local_21;
  memory_input_base<(tao::pegtl::tracking_mode)1,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
  *local_20;
  memory_input<(tao::pegtl::tracking_mode)1,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
  *in_local;
  eol_pair p;
  
  local_21 = false;
  local_20 = &in->
              super_memory_input_base<(tao::pegtl::tracking_mode)1,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
  ;
  sStack_30 = memory_input<(tao::pegtl::tracking_mode)1,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              ::size(in,2);
  std::pair<bool,_unsigned_long>::pair<bool,_unsigned_long,_true>
            ((pair<bool,_unsigned_long> *)&in_local,&local_21,&stack0xffffffffffffffd0);
  uVar2 = extraout_RAX;
  if (p._0_8_ != 0) {
    cVar1 = memory_input<(tao::pegtl::tracking_mode)1,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
            ::peek_char((memory_input<(tao::pegtl::tracking_mode)1,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                         *)local_20,0);
    if (cVar1 == '\n') {
      memory_input_base<(tao::pegtl::tracking_mode)1,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
      ::bump_to_next_line(local_20,1);
      in_local._0_1_ = 1;
      uVar2 = extraout_RAX_00;
    }
    else {
      uVar2 = (ulong)(uint)(int)cVar1;
      if (((int)cVar1 == 0xd) && (1 < (ulong)p._0_8_)) {
        cVar1 = memory_input<(tao::pegtl::tracking_mode)1,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                ::peek_char((memory_input<(tao::pegtl::tracking_mode)1,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                             *)local_20,1);
        uVar2 = (ulong)(uint)(int)cVar1;
        if ((int)cVar1 == 10) {
          memory_input_base<(tao::pegtl::tracking_mode)1,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
          ::bump_to_next_line(local_20,2);
          in_local._0_1_ = 1;
          uVar2 = extraout_RAX_01;
        }
      }
    }
  }
  eVar3._1_7_ = (undefined7)(uVar2 >> 8);
  eVar3.first = (bool)in_local._0_1_;
  eVar3.second = p._0_8_;
  return eVar3;
}

Assistant:

static eol_pair match( Input& in ) noexcept( noexcept( in.size( 2 ) ) )
            {
               eol_pair p = { false, in.size( 2 ) };
               if( p.second ) {
                  const auto a = in.peek_char();
                  if( a == '\n' ) {
                     in.bump_to_next_line();
                     p.first = true;
                  }
                  else if( ( a == '\r' ) && ( p.second > 1 ) && ( in.peek_char( 1 ) == '\n' ) ) {
                     in.bump_to_next_line( 2 );
                     p.first = true;
                  }
               }
               return p;
            }